

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolemaskproxymodel.cpp
# Opt level: O1

void __thiscall RoleMaskProxyModel::setMaskHeaderData(RoleMaskProxyModel *this,bool val)

{
  RoleMaskProxyModelPrivate *pRVar1;
  Data *pDVar2;
  QMap<int,_QVariant> *pQVar3;
  qsizetype qVar4;
  uint uVar5;
  uint uVar6;
  QMap<int,_QVariant> local_70;
  QArrayDataPointer<QMap<int,_QVariant>_> local_68;
  QArrayDataPointer<QMap<int,_QVariant>_> local_48;
  
  pRVar1 = this->d_ptr;
  if (pRVar1->m_maskHeaderData != val) {
    pRVar1->m_maskHeaderData = val;
    local_48.d = (Data *)0xffffffffffffffff;
    local_48.ptr = (QMap<int,_QVariant> *)0x0;
    local_48.size = 0;
    uVar5 = (**(code **)(*(long *)this + 0x80))(this,&local_48);
    local_48.d = (Data *)0xffffffffffffffff;
    local_48.ptr = (QMap<int,_QVariant> *)0x0;
    local_48.size = 0;
    uVar6 = (**(code **)(*(long *)this + 0x78))(this,&local_48);
    if (val) {
      if (0 < (int)uVar5) {
        local_70.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                        )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                          *)0x0;
        QList<QMap<int,_QVariant>_>::QList
                  ((QList<QMap<int,_QVariant>_> *)&local_68,(ulong)uVar5,&local_70);
        qVar4 = local_68.size;
        pQVar3 = local_68.ptr;
        pDVar2 = local_68.d;
        local_68.d = (Data *)0x0;
        local_68.ptr = (QMap<int,_QVariant> *)0x0;
        local_68.size = 0;
        local_48.d = (pRVar1->m_hHeaderData).d.d;
        (pRVar1->m_hHeaderData).d.d = pDVar2;
        local_48.ptr = (pRVar1->m_hHeaderData).d.ptr;
        (pRVar1->m_hHeaderData).d.ptr = pQVar3;
        local_48.size = (pRVar1->m_hHeaderData).d.size;
        (pRVar1->m_hHeaderData).d.size = qVar4;
        QArrayDataPointer<QMap<int,_QVariant>_>::~QArrayDataPointer(&local_48);
        QArrayDataPointer<QMap<int,_QVariant>_>::~QArrayDataPointer(&local_68);
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&local_70.d);
      }
      if (0 < (int)uVar6) {
        local_70.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                        )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                          *)0x0;
        QList<QMap<int,_QVariant>_>::QList
                  ((QList<QMap<int,_QVariant>_> *)&local_68,(ulong)uVar6,&local_70);
        qVar4 = local_68.size;
        pQVar3 = local_68.ptr;
        pDVar2 = local_68.d;
        local_68.d = (Data *)0x0;
        local_68.ptr = (QMap<int,_QVariant> *)0x0;
        local_68.size = 0;
        local_48.d = (pRVar1->m_vHeaderData).d.d;
        (pRVar1->m_vHeaderData).d.d = pDVar2;
        local_48.ptr = (pRVar1->m_vHeaderData).d.ptr;
        (pRVar1->m_vHeaderData).d.ptr = pQVar3;
        local_48.size = (pRVar1->m_vHeaderData).d.size;
        (pRVar1->m_vHeaderData).d.size = qVar4;
        QArrayDataPointer<QMap<int,_QVariant>_>::~QArrayDataPointer(&local_48);
        QArrayDataPointer<QMap<int,_QVariant>_>::~QArrayDataPointer(&local_68);
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&local_70.d);
      }
    }
    else {
      QList<QMap<int,_QVariant>_>::clear(&pRVar1->m_hHeaderData);
      QList<QMap<int,_QVariant>_>::clear(&pRVar1->m_vHeaderData);
    }
    maskHeaderDataChanged(this,val);
    if (0 < (int)uVar5) {
      QAbstractItemModel::headerDataChanged((Orientation)this,1,0);
    }
    if (0 < (int)uVar6) {
      QAbstractItemModel::headerDataChanged((Orientation)this,2,0);
    }
  }
  return;
}

Assistant:

void RoleMaskProxyModel::setMaskHeaderData(bool val)
{
    Q_D(RoleMaskProxyModel);
    if (val == d->m_maskHeaderData)
        return;
    d->m_maskHeaderData = val;
    const int colCnt = columnCount();
    const int rowCnt = rowCount();
    if (val) {
        if (colCnt > 0)
            d->m_hHeaderData = QVector<RolesContainer>(colCnt, RolesContainer());
        if (rowCnt > 0)
            d->m_vHeaderData = QVector<RolesContainer>(rowCnt, RolesContainer());
    } else {
        d->m_hHeaderData.clear();
        d->m_vHeaderData.clear();
    }
    maskHeaderDataChanged(val);
    if (colCnt > 0)
        headerDataChanged(Qt::Horizontal, 0, colCnt - 1);
    if (rowCnt > 0)
        headerDataChanged(Qt::Vertical, 0, rowCnt - 1);
}